

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::append<char[1]>(path *this,char (*source) [1])

{
  path *ppVar1;
  string local_58;
  path local_38;
  char (*local_18) [1];
  char (*source_local) [1];
  path *this_local;
  
  local_18 = source;
  source_local = (char (*) [1])this;
  detail::toUtf8<char>(&local_58,*source);
  path(&local_38,&local_58,auto_format);
  ppVar1 = operator/=(this,&local_38);
  ~path(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return ppVar1;
}

Assistant:

inline path& path::append(const Source& source)
{
    return this->operator/=(path(detail::toUtf8(source)));
}